

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMateGeneric::IntFromDescriptor
          (ChLinkMateGeneric *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  double *pdVar1;
  pointer ppCVar2;
  long lVar3;
  ChConstraintTwoBodies *pCVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  
  lVar5 = (long)(this->mask).nconstr;
  if (0 < lVar5) {
    pdVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    ppCVar2 = (this->mask).constraints.
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    lVar7 = 0;
    iVar8 = 0;
    do {
      if ((this->mask).nconstr <= lVar7) {
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      pCVar4 = ppCVar2[lVar7];
      if ((pCVar4->super_ChConstraintTwo).super_ChConstraint.active == true) {
        uVar6 = iVar8 + off_L;
        if (lVar3 <= (long)(ulong)uVar6) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        iVar8 = iVar8 + 1;
        pdVar1[uVar6] = (pCVar4->super_ChConstraintTwo).super_ChConstraint.l_i;
      }
      lVar7 = lVar7 + 1;
    } while (lVar5 != lVar7);
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntFromDescriptor(const unsigned int off_v,
                                          ChStateDelta& v,
                                          const unsigned int off_L,
                                          ChVectorDynamic<>& L) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            L(off_L + cnt) = mask.Constr_N(i).Get_l_i();
            cnt++;
        }
    }
}